

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::ProcessDefaultAction(Element *this,Event *event)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  EventId EVar3;
  int iVar4;
  EventPhase EVar5;
  float fVar6;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  String local_98;
  String local_78;
  float local_58;
  float fStack_54;
  float fStack_50;
  float local_40;
  float local_3c;
  float local_38;
  
  bVar2 = Event::operator==(event,Mousedown);
  if (bVar2) {
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"mouse_x","");
    local_3c = 0.0;
    local_58 = Event::GetParameter<float>(event,&local_98,&local_3c);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    fStack_54 = extraout_XMM0_Db;
    fStack_50 = extraout_XMM0_Dc;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mouse_y","");
    local_40 = 0.0;
    fVar6 = Event::GetParameter<float>(event,&local_78,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      local_38 = fVar6;
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      fVar6 = local_38;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      fStack_50 = fStack_54;
      fStack_54 = fVar6;
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    iVar4 = (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[7])(local_58,this);
    if ((char)iVar4 != '\0') {
      local_98._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"button","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      iVar4 = Event::GetParameter<int>(event,&local_98,(int *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (iVar4 == 0) {
        local_98._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"active","");
        SetPseudoClass(this,&local_98,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  EVar5 = Event::GetPhase(event);
  if (EVar5 != Target) {
    return;
  }
  EVar3 = Event::GetId(event);
  switch(EVar3) {
  case Mouseover:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"hover","");
    SetPseudoClass(this,&local_98,true);
    break;
  case Mouseout:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"hover","");
    SetPseudoClass(this,&local_98,false);
    break;
  case Focus:
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"focus","");
    SetPseudoClass(this,&local_98,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"focus_visible","");
    local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffffffffff00;
    bVar2 = Event::GetParameter<bool>(event,&local_98,(bool *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      return;
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"focus-visible","");
    SetPseudoClass(this,&local_98,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar1) {
      return;
    }
    goto LAB_0021c7fa;
  case Blur:
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"focus","");
    SetPseudoClass(this,&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"focus-visible","");
    SetPseudoClass(this,&local_98,false);
    break;
  default:
    goto switchD_0021c658_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_0021c7fa:
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
switchD_0021c658_default:
  return;
}

Assistant:

void Element::ProcessDefaultAction(Event& event)
{
	if (event == EventId::Mousedown)
	{
		const Vector2f mouse_pos(event.GetParameter("mouse_x", 0.f), event.GetParameter("mouse_y", 0.f));

		if (IsPointWithinElement(mouse_pos) && event.GetParameter("button", 0) == 0)
			SetPseudoClass("active", true);
	}

	if (event.GetPhase() == EventPhase::Target)
	{
		switch (event.GetId())
		{
		case EventId::Mouseover: SetPseudoClass("hover", true); break;
		case EventId::Mouseout: SetPseudoClass("hover", false); break;
		case EventId::Focus:
			SetPseudoClass("focus", true);
			if (event.GetParameter("focus_visible", false))
				SetPseudoClass("focus-visible", true);
			break;
		case EventId::Blur:
			SetPseudoClass("focus", false);
			SetPseudoClass("focus-visible", false);
			break;
		default: break;
		}
	}
}